

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

int combine_delete_insn(gen_ctx_t gen_ctx,MIR_insn_t def_insn,bb_insn_t_conflict bb_insn)

{
  uint uVar1;
  MIR_reg_t MVar2;
  combine_ctx *pcVar3;
  dead_var_t pdVar4;
  int iVar5;
  DLIST_dead_var_t *list;
  dead_var_t_conflict pdVar6;
  ulong uVar7;
  MIR_reg_t v;
  DLIST_dead_var_t *local_88;
  DLIST_dead_var_t *local_80;
  bb_insn_t_conflict local_78;
  MIR_insn_t local_70;
  long local_68;
  DLIST_dead_var_t *local_60;
  int op_num;
  insn_var_iterator_t local_50;
  
  local_78 = bb_insn;
  if (def_insn->ops[0].field_0x8 != '\x02') {
    __assert_fail("def_insn->ops[0].mode == MIR_OP_VAR",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x2214,"int combine_delete_insn(gen_ctx_t, MIR_insn_t, bb_insn_t)");
  }
  pcVar3 = gen_ctx->combine_ctx;
  uVar1 = def_insn->ops[0].u.reg;
  uVar7 = (ulong)uVar1;
  iVar5 = 0;
  if ((pcVar3->var_ref_ages_addr[uVar7] == pcVar3->curr_bb_var_ref_age) &&
     (local_68 = uVar7 * 0x20, pcVar3->var_refs_addr[uVar7].del_p == '\0')) {
    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      fwrite("      deleting now dead insn ",0x1d,1,(FILE *)gen_ctx->debug_file);
      print_bb_insn(gen_ctx,(bb_insn_t_conflict)def_insn->data,1);
    }
    if (uVar1 == 0xffffffff) {
      __assert_fail("var != (4294967295U)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x222,"void remove_bb_insn_dead_var(gen_ctx_t, bb_insn_t, MIR_reg_t)");
    }
    local_88 = &local_78->insn_dead_vars;
    local_80 = &gen_ctx->free_dead_vars;
    pdVar4 = (local_78->insn_dead_vars).head;
    while (pdVar6 = pdVar4, pdVar6 != (dead_var_t_conflict)0x0) {
      pdVar4 = (pdVar6->dead_var_link).next;
      if (pdVar6->var == uVar1) {
        DLIST_dead_var_t_remove(local_88,pdVar6);
        DLIST_dead_var_t_append(local_80,pdVar6);
      }
    }
    local_60 = (DLIST_dead_var_t *)((long)def_insn->data + 0x38);
    local_70 = def_insn;
    while (pdVar6 = local_60->head, pdVar6 != (dead_var_t_conflict)0x0) {
      DLIST_dead_var_t_remove(local_60,pdVar6);
      MVar2 = pdVar6->var;
      local_50.insn = local_78->insn;
      local_50.nops = (size_t)*(uint *)&(local_50.insn)->field_0x1c;
      local_50.op_num = 0;
      local_50.op_part_num = 0;
      do {
        iVar5 = input_insn_var_iterator_next(gen_ctx,&local_50,&v,&op_num);
        list = local_80;
        if (iVar5 == 0) break;
        list = local_88;
      } while (v != MVar2);
      DLIST_dead_var_t_append(list,pdVar6);
    }
    gen_delete_insn(gen_ctx,local_70);
    (&gen_ctx->combine_ctx->var_refs_addr->del_p)[local_68] = '\x01';
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

static int combine_delete_insn (gen_ctx_t gen_ctx, MIR_insn_t def_insn, bb_insn_t bb_insn) {
  MIR_reg_t var;

  gen_assert (def_insn->ops[0].mode == MIR_OP_VAR);
  var = def_insn->ops[0].u.var;
  if (var_ref_ages_addr[var] != curr_bb_var_ref_age || var_refs_addr[var].del_p) return FALSE;
  DEBUG (2, {
    fprintf (debug_file, "      deleting now dead insn ");
    print_bb_insn (gen_ctx, def_insn->data, TRUE);
  });
  remove_bb_insn_dead_var (gen_ctx, bb_insn, var);
  move_bb_insn_dead_vars (gen_ctx, bb_insn, def_insn->data, hard_reg_used_in_bb_insn_p);
  /* We should delete the def insn here because of possible substitution of the def
     insn 'r0 = ... r0 ...'.  We still need valid entry for def here to find obsolete
     definiton, e.g. "r1 = r0; r0 = ...; r0 = ... (deleted); ...= ...r1..." */
  gen_delete_insn (gen_ctx, def_insn);
  var_refs_addr[var].del_p = TRUE; /* to exclude repetitive deletion */
  return TRUE;
}